

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  long lVar1;
  sqlite3 *db;
  sqlite3 *db_00;
  char *pcVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int f;
  int i;
  char *zBind;
  char *zSql;
  Fts5Config *pC;
  int rc;
  char *azStmt [12];
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  bool bVar3;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  int local_6c;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  char *pcStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = 0;
  if (in_RDI[(long)(int)in_ESI + 6] == 0) {
    local_18 = "REPLACE INTO %Q.\'%q_config\' VALUES(?,?)";
    pcStack_10 = "SELECT %s FROM %s AS T";
    local_28 = "DELETE FROM %Q.\'%q_docsize\' WHERE id=?";
    pcStack_20 = "SELECT sz%s FROM %Q.\'%q_docsize\' WHERE id=?";
    local_38 = "DELETE FROM %Q.\'%q_content\' WHERE id=?";
    pcStack_30 = "REPLACE INTO %Q.\'%q_docsize\' VALUES(?,?%s)";
    local_48 = "INSERT INTO %Q.\'%q_content\' VALUES(%s)";
    pcStack_40 = "REPLACE INTO %Q.\'%q_content\' VALUES(%s)";
    local_58 = "SELECT %s FROM %s T WHERE T.%Q=?";
    pcStack_50 = "SELECT %s FROM %s T WHERE T.%Q=?";
    local_68._0_4_ = 0x2b893f;
    local_68._4_4_ = 0;
    uStack_60 = 0x2b8983;
    uStack_5c = 0;
    lVar1 = *in_RDI;
    db = (sqlite3 *)(ulong)in_ESI;
    switch(db) {
    case (sqlite3 *)0x0:
    case (sqlite3 *)0x1:
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],*(undefined8 *)(lVar1 + 0x78),
                              *(undefined8 *)(lVar1 + 0x58),*(undefined8 *)(lVar1 + 0x60),
                              *(undefined8 *)(lVar1 + 0x60),*(undefined8 *)(lVar1 + 0x60));
      break;
    case (sqlite3 *)0x2:
    case (sqlite3 *)0x3:
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],*(undefined8 *)(lVar1 + 0x78),
                              *(undefined8 *)(lVar1 + 0x58),*(undefined8 *)(lVar1 + 0x60));
      break;
    case (sqlite3 *)0x4:
    case (sqlite3 *)0x5:
      in_stack_ffffffffffffff58 = (char *)0x0;
      in_stack_ffffffffffffff54 = 0;
      while( true ) {
        bVar3 = false;
        if (local_6c == 0) {
          bVar3 = in_stack_ffffffffffffff54 < *(int *)(lVar1 + 0x20) + 1;
        }
        if (!bVar3) break;
        if (((in_stack_ffffffffffffff54 == 0) || (*(int *)(lVar1 + 0x48) == 0)) ||
           (*(char *)(*(long *)(lVar1 + 0x30) + (long)(in_stack_ffffffffffffff54 + -1)) != '\0')) {
          pcVar2 = "";
          if (in_stack_ffffffffffffff58 != (char *)0x0) {
            pcVar2 = ",";
          }
          in_stack_ffffffffffffff58 =
               sqlite3Fts5Mprintf(&local_6c,"%z%s?%d",in_stack_ffffffffffffff58,pcVar2,
                                  (ulong)(in_stack_ffffffffffffff54 + 1));
        }
        in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1;
      }
      in_stack_ffffffffffffff47 = 0;
      if ((*(int *)(lVar1 + 0x70) != 0) && (*(int *)(lVar1 + 0x48) == 0)) {
        in_stack_ffffffffffffff54 = 0;
        while( true ) {
          bVar3 = false;
          if (local_6c == 0) {
            bVar3 = in_stack_ffffffffffffff54 < *(int *)(lVar1 + 0x20);
          }
          if (!bVar3) break;
          if (*(char *)(*(long *)(lVar1 + 0x30) + (long)in_stack_ffffffffffffff54) == '\0') {
            in_stack_ffffffffffffff58 =
                 sqlite3Fts5Mprintf(&local_6c,"%z,?%d",in_stack_ffffffffffffff58,
                                    (ulong)(*(int *)(lVar1 + 0x20) + in_stack_ffffffffffffff54 + 2))
            ;
          }
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1;
        }
        in_stack_ffffffffffffff46 = 0;
      }
      db_00 = (sqlite3 *)
              sqlite3Fts5Mprintf(&local_6c,(char *)(&local_68)[(int)in_ESI],
                                 *(undefined8 *)(lVar1 + 0x10),*(undefined8 *)(lVar1 + 0x18),
                                 in_stack_ffffffffffffff58);
      sqlite3_free((void *)0x26a223);
      break;
    default:
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],*(undefined8 *)(lVar1 + 0x10),
                              *(undefined8 *)(lVar1 + 0x18));
      break;
    case (sqlite3 *)0x7:
      pcVar2 = "";
      if (*(int *)(lVar1 + 0x4c) != 0) {
        pcVar2 = ",?";
      }
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],*(undefined8 *)(lVar1 + 0x10),
                              *(undefined8 *)(lVar1 + 0x18),pcVar2);
      break;
    case (sqlite3 *)0x9:
      pcVar2 = "";
      if (*(int *)(lVar1 + 0x4c) != 0) {
        pcVar2 = ",origin";
      }
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],pcVar2,*(undefined8 *)(lVar1 + 0x10),
                              *(undefined8 *)(lVar1 + 0x18));
      break;
    case (sqlite3 *)0xb:
      db_00 = (sqlite3 *)
              sqlite3_mprintf((char *)(&local_68)[(int)in_ESI],*(undefined8 *)(lVar1 + 0x78),
                              *(undefined8 *)(lVar1 + 0x58));
    }
    if (db_00 == (sqlite3 *)0x0) {
      local_6c = 7;
    }
    else {
      in_stack_ffffffffffffff50 = 1;
      if (3 < (int)in_ESI) {
        in_stack_ffffffffffffff50 = 5;
      }
      *(int *)(*in_RDI + 0xb8) = *(int *)(*in_RDI + 0xb8) + 1;
      local_6c = sqlite3_prepare_v3(db_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    in_stack_ffffffffffffff50,(sqlite3_stmt **)db,
                                    (char **)CONCAT17(in_stack_ffffffffffffff47,
                                                      CONCAT16(in_stack_ffffffffffffff46,
                                                               CONCAT24(in_stack_ffffffffffffff44,
                                                                        in_stack_ffffffffffffff40)))
                                   );
      *(int *)(*in_RDI + 0xb8) = *(int *)(*in_RDI + 0xb8) + -1;
      sqlite3_free((void *)0x26a380);
      if ((local_6c != 0) && (in_RCX != (undefined8 *)0x0)) {
        pcVar2 = sqlite3_errmsg(db);
        pcVar2 = sqlite3_mprintf("%s",pcVar2);
        *in_RCX = pcVar2;
      }
      if (((local_6c == 1) && (3 < (int)in_ESI)) && ((int)in_ESI < 0xb)) {
        local_6c = 0xb;
      }
    }
  }
  *in_RDX = in_RDI[(long)(int)in_ESI + 6];
  sqlite3_reset((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP2  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?%s)",     /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz%s FROM %Q.'%q_docsize' WHERE id=?",    /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    assert( ArraySize(azStmt)==ArraySize(p->aStmt) );

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist,
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
      case FTS5_STMT_LOOKUP2:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT:
      case FTS5_STMT_REPLACE_CONTENT: {
        char *zBind = 0;
        int i;

        assert( pC->eContent==FTS5_CONTENT_NORMAL
             || pC->eContent==FTS5_CONTENT_UNINDEXED
        );

        /* Add bindings for the "c*" columns - those that store the actual
        ** table content. If eContent==NORMAL, then there is one binding
        ** for each column. Or, if eContent==UNINDEXED, then there are only
        ** bindings for the UNINDEXED columns. */
        for(i=0; rc==SQLITE_OK && i<(pC->nCol+1); i++){
          if( !i || pC->eContent==FTS5_CONTENT_NORMAL || pC->abUnindexed[i-1] ){
            zBind = sqlite3Fts5Mprintf(&rc, "%z%s?%d", zBind, zBind?",":"",i+1);
          }
        }

        /* Add bindings for any "l*" columns. Only non-UNINDEXED columns
        ** require these.  */
        if( pC->bLocale && pC->eContent==FTS5_CONTENT_NORMAL ){
          for(i=0; rc==SQLITE_OK && i<pC->nCol; i++){
            if( pC->abUnindexed[i]==0 ){
              zBind = sqlite3Fts5Mprintf(&rc, "%z,?%d", zBind, pC->nCol+i+2);
            }
          }
        }

        zSql = sqlite3Fts5Mprintf(&rc, azStmt[eStmt], pC->zDb, pC->zName,zBind);
        sqlite3_free(zBind);
        break;
      }

      case FTS5_STMT_REPLACE_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName,
          (pC->bContentlessDelete ? ",?" : "")
        );
        break;

      case FTS5_STMT_LOOKUP_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            (pC->bContentlessDelete ? ",origin" : ""),
            pC->zDb, pC->zName
        );
        break;

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP2 ) f |= SQLITE_PREPARE_NO_VTAB;
      p->pConfig->bLock++;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      p->pConfig->bLock--;
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
      if( rc==SQLITE_ERROR && eStmt>FTS5_STMT_LOOKUP2 && eStmt<FTS5_STMT_SCAN ){
        /* One of the internal tables - not the %_content table - is missing.
        ** This counts as a corrupted table.  */
       rc = SQLITE_CORRUPT;
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}